

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

bool bsim::operator>(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  byte bVar1;
  uint in_ECX;
  int iVar2;
  ulong uVar3;
  byte *in_RDX;
  byte bVar4;
  ulong uVar5;
  
  if (0 < (int)b) {
    if (1 < *(byte *)&(a->bits).
                      super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
      return false;
    }
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if (((ulong)b & 0xffffffff) == uVar5) break;
      uVar3 = uVar5 + 1;
    } while (*(byte *)((long)&(a->bits).
                              super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar5) < 2);
    if (uVar5 < ((ulong)b & 0xffffffff)) {
      return false;
    }
  }
  if ((int)in_ECX < 1) {
LAB_0013e14e:
    uVar3 = (ulong)b & 0xffffffff;
    do {
      bVar4 = (byte)b;
      iVar2 = (int)uVar3;
      if (iVar2 < 1) goto LAB_0013e18c;
      bVar4 = *(byte *)((long)a + (uVar3 - 1));
      b = (quad_value_bit_vector *)(ulong)bVar4;
      if (bVar4 == 3) {
        __assert_fail("!a.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xde,"bool bsim::operator>(const quad_value &, const quad_value &)");
      }
      bVar1 = in_RDX[uVar3 - 1];
      if (bVar1 == 3) {
        __assert_fail("!b.is_high_impedance()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xdf,"bool bsim::operator>(const quad_value &, const quad_value &)");
      }
      if (1 < bVar4) {
        __assert_fail("a.is_binary()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xe1,"bool bsim::operator>(const quad_value &, const quad_value &)");
      }
      if (1 < bVar1) {
        __assert_fail("b.is_binary()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0xe2,"bool bsim::operator>(const quad_value &, const quad_value &)");
      }
      if (bVar1 < bVar4) {
        bVar4 = 1;
        goto LAB_0013e18c;
      }
      uVar3 = uVar3 - 1;
    } while (bVar1 <= bVar4);
    bVar4 = 0;
LAB_0013e18c:
    return (bool)(0 < iVar2 & bVar4);
  }
  if (*in_RDX < 2) {
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if (in_ECX == uVar5) break;
      uVar3 = uVar5 + 1;
    } while (in_RDX[uVar5] < 2);
    if (in_ECX <= uVar5) goto LAB_0013e14e;
  }
  return false;
}

Assistant:

static inline bool operator>(const quad_value_bit_vector& a,
  			       const quad_value_bit_vector& b) {
    if (!a.is_binary() || !b.is_binary()) {
      return false;
    }

    int N = a.bitLength();
    for (int i = N - 1; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
  	return true;
      }

      if (a.get(i) < b.get(i)) {
  	return false;
      }
    }

    return false;
  }